

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side1_4d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_c0;
  double upper_bound_1;
  double lower_bound_1;
  double max2;
  double max1;
  double eps;
  int int_tmp_result;
  double q0_3_p0_3;
  double p1_3_p0_3;
  double q0_2_p0_2;
  double p1_2_p0_2;
  double q0_1_p0_1;
  double p1_1_p0_1;
  double q0_0_p0_0;
  double p1_0_p0_0;
  double r;
  double p0_3_p1_3;
  double p0_2_p1_2;
  double p0_1_p1_1;
  double p0_0_p1_0;
  double *q0_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p0 - *p1;
  dVar2 = p0[1] - p1[1];
  dVar3 = p0[2] - p1[2];
  dVar4 = p0[3] - p1[3];
  dVar5 = *q0 - *p0;
  dVar6 = p1[1] - p0[1];
  dVar7 = q0[1] - p0[1];
  dVar8 = p1[2] - p0[2];
  dVar9 = q0[2] - p0[2];
  dVar10 = p1[3] - p0[3];
  dVar11 = q0[3] - p0[3];
  dVar12 = dVar10 * dVar11 + dVar8 * dVar9 + (*p1 - *p0) * dVar5 + dVar6 * dVar7;
  dVar12 = (dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 1.0 - (dVar12 + dVar12)
  ;
  max2 = ABS(*p1 - *p0);
  if (max2 < ABS(dVar1)) {
    max2 = ABS(dVar1);
  }
  if (max2 < ABS(dVar2)) {
    max2 = ABS(dVar2);
  }
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar4)) {
    max2 = ABS(dVar4);
  }
  if (max2 < ABS(dVar6)) {
    max2 = ABS(dVar6);
  }
  if (max2 < ABS(dVar8)) {
    max2 = ABS(dVar8);
  }
  if (max2 < ABS(dVar10)) {
    max2 = ABS(dVar10);
  }
  lower_bound_1 = ABS(dVar1);
  if (lower_bound_1 < ABS(dVar2)) {
    lower_bound_1 = ABS(dVar2);
  }
  if (lower_bound_1 < ABS(dVar3)) {
    lower_bound_1 = ABS(dVar3);
  }
  if (lower_bound_1 < ABS(dVar4)) {
    lower_bound_1 = ABS(dVar4);
  }
  if (lower_bound_1 < ABS(dVar5)) {
    lower_bound_1 = ABS(dVar5);
  }
  if (lower_bound_1 < ABS(dVar7)) {
    lower_bound_1 = ABS(dVar7);
  }
  if (lower_bound_1 < ABS(dVar9)) {
    lower_bound_1 = ABS(dVar9);
  }
  if (lower_bound_1 < ABS(dVar11)) {
    lower_bound_1 = ABS(dVar11);
  }
  upper_bound_1 = lower_bound_1;
  local_c0 = lower_bound_1;
  if (lower_bound_1 <= max2) {
    if (lower_bound_1 < max2) {
      local_c0 = max2;
    }
  }
  else {
    upper_bound_1 = max2;
  }
  if (1.8581679070329353e-147 <= upper_bound_1) {
    if (local_c0 <= 5.599361855444509e+101) {
      dVar1 = max2 * lower_bound_1 * 6.444281772791857e-15;
      if (dVar12 <= dVar1) {
        if (-dVar1 <= dVar12) {
          return 0;
        }
        eps._4_4_ = -1;
      }
      else {
        eps._4_4_ = 1;
      }
      p0_local._4_4_ = eps._4_4_;
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side1_4d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double r;
    r = (1 * ((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    r = (r - (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p0_0_p1_0)) )
    {
        max1 = fabs(p0_0_p1_0);
    } 
    if( (max1 < fabs(p0_1_p1_1)) )
    {
        max1 = fabs(p0_1_p1_1);
    } 
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    double max2 = fabs(p0_0_p1_0);
    if( (max2 < fabs(p0_1_p1_1)) )
    {
        max2 = fabs(p0_1_p1_1);
    } 
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.85816790703293534018e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (6.44428177279185717888e-15 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}